

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O1

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextLineComment(Lexer *this)

{
  uint uVar1;
  Lexer *in_RSI;
  
  nextChar(in_RSI);
  if ((in_RSI->currentChar == 0x21) || (in_RSI->currentChar == 0x2a)) {
    nextLineCommentDoc(this);
  }
  else {
    while ((uVar1 = in_RSI->currentChar + 1, 0xe < uVar1 || ((0x4801U >> (uVar1 & 0x1f) & 1) == 0)))
    {
      nextChar(in_RSI);
    }
    nextToken(this);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextLineComment() noexcept {
  nextChar(); // eat /
  if (currentChar == '*' || currentChar == '!')
    return nextLineCommentDoc();

  while (currentChar != EOF && currentChar != '\n' && currentChar != '\r')
    nextChar();

  return nextToken();
}